

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O0

int get_url(void)

{
  int iVar1;
  char *local_28;
  char *url;
  CURLU *urlp;
  int local_10;
  CURLUcode rc;
  int error;
  int i;
  
  local_10 = 0;
  rc = CURLUE_OK;
  while( true ) {
    if (get_url_list[(int)rc].in == (char *)0x0 || local_10 != 0) {
      return local_10;
    }
    url = (char *)curl_url();
    if (url == (char *)0x0) break;
    urlp._4_4_ = curl_url_set(url,0,get_url_list[(int)rc].in,get_url_list[(int)rc].urlflags);
    if (urlp._4_4_ == CURLUE_OK) {
      local_28 = (char *)0x0;
      urlp._4_4_ = curl_url_get(url,0,&local_28,get_url_list[(int)rc].getflags);
      if (urlp._4_4_ == CURLUE_OK) {
        iVar1 = checkurl(local_28,get_url_list[(int)rc].out);
        if (iVar1 != 0) {
          local_10 = local_10 + 1;
        }
      }
      else {
        curl_mfprintf(_stderr,"%s:%d returned %d\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1560.c"
                      ,0x330,urlp._4_4_);
        local_10 = local_10 + 1;
      }
      curl_free(local_28);
    }
    else if (urlp._4_4_ != get_url_list[(int)rc].ucode) {
      curl_mfprintf(_stderr,"Get URL\nin: %s\nreturned %d (expected %d)\n",get_url_list[(int)rc].in,
                    urlp._4_4_,get_url_list[(int)rc].ucode);
      local_10 = local_10 + 1;
    }
    curl_url_cleanup(url);
    rc = rc + CURLUE_BAD_HANDLE;
  }
  return local_10 + 1;
}

Assistant:

static int get_url(void)
{
  int i;
  int error = 0;
  for(i = 0; get_url_list[i].in && !error; i++) {
    CURLUcode rc;
    CURLU *urlp = curl_url();
    if(!urlp) {
      error++;
      break;
    }
    rc = curl_url_set(urlp, CURLUPART_URL, get_url_list[i].in,
                      get_url_list[i].urlflags);
    if(!rc) {
      char *url = NULL;
      rc = curl_url_get(urlp, CURLUPART_URL, &url, get_url_list[i].getflags);

      if(rc) {
        fprintf(stderr, "%s:%d returned %d\n",
                __FILE__, __LINE__, (int)rc);
        error++;
      }
      else {
        if(checkurl(url, get_url_list[i].out)) {
          error++;
        }
      }
      curl_free(url);
    }
    else if(rc != get_url_list[i].ucode) {
      fprintf(stderr, "Get URL\nin: %s\nreturned %d (expected %d)\n",
              get_url_list[i].in, (int)rc, get_url_list[i].ucode);
      error++;
    }
    curl_url_cleanup(urlp);
  }
  return error;
}